

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_chacha20poly1305.cc
# Opt level: O3

int aead_xchacha20_poly1305_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  uint8_t derived_nonce [12];
  uint8_t derived_key [32];
  
  if (nonce_len == 0x18) {
    CRYPTO_hchacha20(derived_key,(ctx->state).opaque,nonce);
    derived_nonce[0] = '\0';
    derived_nonce[1] = '\0';
    derived_nonce[2] = '\0';
    derived_nonce[3] = '\0';
    derived_nonce._4_8_ = *(undefined8 *)(nonce + 0x10);
    iVar1 = chacha20_poly1305_open_gather
                      (derived_key,out,derived_nonce,0xc,in,in_len,in_tag,in_tag_len,ad,ad_len,
                       (ulong)ctx->tag_len);
  }
  else {
    iVar1 = 0;
    ERR_put_error(0x1e,0,0x79,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_chacha20poly1305.cc"
                  ,0x11e);
  }
  return iVar1;
}

Assistant:

static int aead_xchacha20_poly1305_open_gather(
    const EVP_AEAD_CTX *ctx, uint8_t *out, const uint8_t *nonce,
    size_t nonce_len, const uint8_t *in, size_t in_len, const uint8_t *in_tag,
    size_t in_tag_len, const uint8_t *ad, size_t ad_len) {
  const struct aead_chacha20_poly1305_ctx *c20_ctx =
      (struct aead_chacha20_poly1305_ctx *)&ctx->state;

  if (nonce_len != 24) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_NONCE_SIZE);
    return 0;
  }

  alignas(4) uint8_t derived_key[32];
  alignas(4) uint8_t derived_nonce[12];
  CRYPTO_hchacha20(derived_key, c20_ctx->key, nonce);
  OPENSSL_memset(derived_nonce, 0, 4);
  OPENSSL_memcpy(&derived_nonce[4], &nonce[16], 8);

  return chacha20_poly1305_open_gather(
      derived_key, out, derived_nonce, sizeof(derived_nonce), in, in_len,
      in_tag, in_tag_len, ad, ad_len, ctx->tag_len);
}